

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int archive_read_format_rar_read_data(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  void *pvVar1;
  byte *pbVar2;
  long lVar3;
  int iVar4;
  size_t in_RAX;
  uchar *buf;
  uLong uVar5;
  long lVar6;
  char *fmt;
  size_t local_38;
  
  pvVar1 = a->format->data;
  if (*(int *)((long)pvVar1 + 0x4f50) == -1) {
    *(undefined4 *)((long)pvVar1 + 0x4f50) = 0;
  }
  local_38 = in_RAX;
  if (0 < *(long *)((long)pvVar1 + 0xa0)) {
    __archive_read_consume(a,*(long *)((long)pvVar1 + 0xa0));
    *(undefined8 *)((long)pvVar1 + 0xa0) = 0;
  }
  *buff = (void *)0x0;
  if ((*(char *)((long)pvVar1 + 0xed) == '\0') &&
     (*(long *)((long)pvVar1 + 200) < *(long *)((long)pvVar1 + 0x28))) {
    if (*(byte *)((long)pvVar1 + 0x17) - 0x31 < 5) {
      iVar4 = read_data_compressed(a,buff,size,offset,0);
      if (iVar4 == -0x14) {
        return -0x14;
      }
      if (iVar4 == 0) {
        return 0;
      }
      Ppmd7_Free((CPpmd7 *)((long)pvVar1 + 0x3d8));
      *(undefined1 *)((long)pvVar1 + 0x388) = 1;
      *(undefined1 *)((long)pvVar1 + 0x3d0) = 0;
      return iVar4;
    }
    if (*(byte *)((long)pvVar1 + 0x17) == 0x30) {
      pbVar2 = (byte *)a->format->data;
      if ((*(long *)(pbVar2 + 0xa8) == 0) && (((*pbVar2 & 1) == 0 || ((pbVar2[0x18] & 2) == 0)))) {
        *buff = (void *)0x0;
        *size = 0;
        *offset = *(int64_t *)(pbVar2 + 0xb8);
        if (*(long *)(pbVar2 + 8) == *(long *)(pbVar2 + 0xf0)) {
          pbVar2[0xed] = 1;
          goto LAB_00153c4e;
        }
        fmt = "File CRC error";
      }
      else {
        buf = (uchar *)rar_read_ahead(a,1,(ssize_t *)&local_38);
        *buff = buf;
        if (0 < (long)local_38) {
          *size = local_38;
          lVar3 = *(long *)(pbVar2 + 0xb8);
          *offset = lVar3;
          *(size_t *)(pbVar2 + 0xb8) = lVar3 + local_38;
          *(size_t *)(pbVar2 + 200) = *(long *)(pbVar2 + 200) + local_38;
          *(size_t *)(pbVar2 + 0xa8) = *(long *)(pbVar2 + 0xa8) - local_38;
          *(size_t *)(pbVar2 + 0xa0) = local_38;
          uVar5 = cm_zlib_crc32(*(unsigned_long *)(pbVar2 + 0xf0),buf,(uInt)local_38);
          *(uLong *)(pbVar2 + 0xf0) = uVar5;
          return 0;
        }
        fmt = "Truncated RAR file data";
      }
    }
    else {
      fmt = "Unsupported compression method for RAR file.";
    }
    archive_set_error(&a->archive,0x54,fmt);
    iVar4 = -0x1e;
  }
  else {
    *size = 0;
    lVar3 = *(long *)((long)pvVar1 + 0xb8);
    *offset = lVar3;
    lVar6 = *(long *)((long)pvVar1 + 0x28);
    if (*(long *)((long)pvVar1 + 0x28) < lVar3) {
      lVar6 = lVar3;
    }
    *offset = lVar6;
LAB_00153c4e:
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

static int
archive_read_format_rar_read_data(struct archive_read *a, const void **buff,
                                  size_t *size, int64_t *offset)
{
  struct rar *rar = (struct rar *)(a->format->data);
  int ret;

  if (rar->has_encrypted_entries == ARCHIVE_READ_FORMAT_ENCRYPTION_DONT_KNOW) {
	  rar->has_encrypted_entries = 0;
  }

  if (rar->bytes_unconsumed > 0) {
      /* Consume as much as the decompressor actually used. */
      __archive_read_consume(a, rar->bytes_unconsumed);
      rar->bytes_unconsumed = 0;
  }

  *buff = NULL;
  if (rar->entry_eof || rar->offset_seek >= rar->unp_size) {
    *size = 0;
    *offset = rar->offset;
    if (*offset < rar->unp_size)
      *offset = rar->unp_size;
    return (ARCHIVE_EOF);
  }

  switch (rar->compression_method)
  {
  case COMPRESS_METHOD_STORE:
    ret = read_data_stored(a, buff, size, offset);
    break;

  case COMPRESS_METHOD_FASTEST:
  case COMPRESS_METHOD_FAST:
  case COMPRESS_METHOD_NORMAL:
  case COMPRESS_METHOD_GOOD:
  case COMPRESS_METHOD_BEST:
    ret = read_data_compressed(a, buff, size, offset, 0);
    if (ret != ARCHIVE_OK && ret != ARCHIVE_WARN) {
      __archive_ppmd7_functions.Ppmd7_Free(&rar->ppmd7_context);
      rar->start_new_table = 1;
      rar->ppmd_valid = 0;
    }
    break;

  default:
    archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                      "Unsupported compression method for RAR file.");
    ret = ARCHIVE_FATAL;
    break;
  }
  return (ret);
}